

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_read_signature_restartable
              (mbedtls_ecdsa_context *ctx,uchar *hash,size_t hlen,uchar *sig,size_t slen,
              mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  int iVar1;
  uchar *end;
  uchar *p;
  size_t len;
  mbedtls_mpi s;
  mbedtls_mpi r;
  mbedtls_ecdsa_restart_ctx *in_stack_ffffffffffffff88;
  uchar *local_70;
  size_t local_68;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  end = sig + slen;
  local_70 = sig;
  mbedtls_mpi_init(&local_48);
  mbedtls_mpi_init(&local_60);
  iVar1 = mbedtls_asn1_get_tag(&local_70,end,&local_68,0x30);
  if (iVar1 == 0) {
    iVar1 = -0x4fe6;
    if (local_70 + local_68 != end) goto LAB_0012781d;
    iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&local_48);
    if ((iVar1 == 0) && (iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&local_60), iVar1 == 0)) {
      iVar1 = ecdsa_verify_restartable
                        (&ctx->grp,hash,hlen,&ctx->Q,&local_48,&local_60,in_stack_ffffffffffffff88);
      if (iVar1 == 0) {
        iVar1 = -0x4c00;
        if (local_70 == end) {
          iVar1 = 0;
        }
      }
      goto LAB_0012781d;
    }
  }
  iVar1 = iVar1 + -0x4f80;
LAB_0012781d:
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_60);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_read_signature_restartable( mbedtls_ecdsa_context *ctx,
                          const unsigned char *hash, size_t hlen,
                          const unsigned char *sig, size_t slen,
                          mbedtls_ecdsa_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = (unsigned char *) sig;
    const unsigned char *end = sig + slen;
    size_t len;
    mbedtls_mpi r, s;
    ECDSA_VALIDATE_RET( ctx  != NULL );
    ECDSA_VALIDATE_RET( hash != NULL );
    ECDSA_VALIDATE_RET( sig  != NULL );

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( p + len != end )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
        goto cleanup;
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &r ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &s ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }
#if defined(MBEDTLS_ECDSA_VERIFY_ALT)
    if( ( ret = mbedtls_ecdsa_verify( &ctx->grp, hash, hlen,
                                      &ctx->Q, &r, &s ) ) != 0 )
        goto cleanup;
#else
    if( ( ret = ecdsa_verify_restartable( &ctx->grp, hash, hlen,
                              &ctx->Q, &r, &s, rs_ctx ) ) != 0 )
        goto cleanup;
#endif /* MBEDTLS_ECDSA_VERIFY_ALT */

    /* At this point we know that the buffer starts with a valid signature.
     * Return 0 if the buffer just contains the signature, and a specific
     * error code if the valid signature is followed by more data. */
    if( p != end )
        ret = MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH;

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}